

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterSparseCoDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  double dVar2;
  int i;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  DataKey DVar8;
  DataKey DVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  lVar11 = (long)(pSVar4->infeasibilitiesCo).super_IdxSet.num;
  if (lVar11 < 1) {
    DVar9.info = 0;
    DVar9.idx = -1;
  }
  else {
    pdVar5 = (pSVar4->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (pSVar4->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = lVar11 + 1;
    uVar10 = 0xffffffff;
    DVar8.info = 0;
    DVar8.idx = 0;
    do {
      pSVar4 = (this->super_SPxPricer<double>).thesolver;
      piVar7 = (pSVar4->infeasibilitiesCo).super_IdxSet.idx;
      i = piVar7[uVar12 - 2];
      dVar1 = pdVar5[i];
      if (-tol <= dVar1) {
        iVar3 = (pSVar4->infeasibilitiesCo).super_IdxSet.num;
        (pSVar4->infeasibilitiesCo).super_IdxSet.num = iVar3 + -1;
        piVar7[uVar12 - 2] = piVar7[(long)iVar3 + -1];
        (pSVar4->isInfeasibleCo).data[i] = 0;
      }
      else {
        dVar2 = pdVar6[i];
        dVar13 = tol;
        if (tol <= dVar2) {
          dVar13 = dVar2;
        }
        dVar13 = (dVar1 * dVar1) / dVar13;
        if (*best <= dVar13 && dVar13 != *best) {
          *best = dVar13;
          DVar8 = (DataKey)SPxSolverBase<double>::id(pSVar4,i);
          uVar10 = (ulong)DVar8 >> 0x20;
        }
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
    DVar9 = (DataKey)((ulong)DVar8 & 0xffffffff | uVar10 << 0x20);
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseCoDim(R& best, R tol)
{
   SPxId enterId;
   const R* test          = this->thesolver->test().get_const_ptr();
   const R* weights_ptr   = this->thesolver->weights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         if(x > best)
         {
            best   = x;
            enterId = this->thesolver->id(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}